

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O0

unsigned_short med3char<unsigned_short>(unsigned_short a,unsigned_short b,unsigned_short c)

{
  unsigned_short local_a;
  unsigned_short c_local;
  unsigned_short b_local;
  unsigned_short a_local;
  
  local_a = a;
  if (((a != b) && (local_a = c, c != a)) && (c != b)) {
    local_a = b;
    if (a < b) {
      if ((c <= b) && (local_a = a, a < c)) {
        local_a = c;
      }
    }
    else if ((b <= c) && (local_a = c, a < c)) {
      local_a = a;
    }
  }
  return local_a;
}

Assistant:

CharT
med3char(CharT a, CharT b, CharT c)
{
	if (a == b)           return a;
	if (c == a || c == b) return c;
	if (a < b) {
		if (b < c) return b;
		if (a < c) return c;
		return a;
	}
	if (b > c) return b;
	if (a < c) return a;
	return c;
}